

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::auto_manage_checking_torrents
          (session_impl *this,
          vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_> *list,
          int *limit)

{
  pointer pptVar1;
  bool bVar2;
  torrent **t;
  pointer pptVar3;
  
  pptVar1 = (list->
            super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (pptVar3 = (list->
                 super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; pptVar3 != pptVar1;
      pptVar3 = pptVar3 + 1) {
    if (*limit < 1) {
      torrent::pause(*pptVar3);
    }
    else {
      torrent::resume(*pptVar3);
      bVar2 = torrent::should_check_files(*pptVar3);
      if (bVar2) {
        torrent::start_checking(*pptVar3);
        *limit = *limit + -1;
      }
    }
  }
  return;
}

Assistant:

void session_impl::auto_manage_checking_torrents(std::vector<torrent*>& list
		, int& limit)
	{
		for (auto& t : list)
		{
			TORRENT_ASSERT(t->state() == torrent_status::checking_files);
			TORRENT_ASSERT(t->is_auto_managed());
			if (limit <= 0)
			{
				t->pause();
			}
			else
			{
				t->resume();
				if (!t->should_check_files()) continue;
				t->start_checking();
				--limit;
			}
		}
	}